

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O0

int anon_unknown.dwarf_1e6e5::ChannelOut_mono(lua_State *L)

{
  ChannelOut *this;
  long xs_2;
  lua_Integer m;
  ChannelOut *self;
  lua_State *L_local;
  
  this = getChannelOut(L,1);
  xs_2 = luaL_optinteger(L,2,0);
  if ((xs_2 < 0) || (0x10 < xs_2)) {
    luaL_argerror(L,2,"Channel count must be between 0 and 16");
  }
  ChannelOut::send<int,int,long>(this,this->index + 0xb0,0x7e,xs_2);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_mono(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer m = luaL_optinteger(L, 2, 0);
	luaL_argcheck(L, m >= 0 && m <= 16, 2, "Channel count must be between 0 and 16");
	self.send(0xB0 + self.index, 0x7E, m);
	lua_settop(L, 1);
	return 1;
}